

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  MaterialFileReader *pMVar4;
  istream *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  string *psVar10;
  long lVar11;
  bool bVar12;
  string filepath_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string filepath;
  string s;
  stringstream ss;
  istringstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  string *local_420;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_418;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  value_type local_3e8;
  MaterialFileReader *local_3c8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  byte abStack_3a0 [96];
  ios_base local_340 [392];
  istringstream local_1b8 [16];
  ostream local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  local_418 = matMap;
  local_410 = materials;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    pcVar3 = (matId->_M_dataplus)._M_p;
    psVar10 = warn;
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar3,pcVar3 + matId->_M_string_length);
    std::ifstream::ifstream(local_3c0,local_458._M_dataplus._M_p,_S_in);
    bVar12 = (abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0;
    if (bVar12) {
      LoadMtl(local_418,local_410,(istream *)local_3c0,warn,psVar10);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Material file [ ",0x10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_458._M_dataplus._M_p,local_458._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ] not found in a path : ",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(this->m_mtlBaseDir)._M_dataplus._M_p,
                          (this->m_mtlBaseDir)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (warn,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    std::ifstream::~ifstream(local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
  }
  else {
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar10 = warn;
    std::__cxx11::istringstream::istringstream(local_1b8,(string *)&this->m_mtlBaseDir,_S_in);
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    local_3e8._M_string_length = 0;
    local_3e8.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)&local_3e8,':');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_438,&local_3e8);
    }
    local_420 = warn;
    local_3c8 = this;
    if (local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar1 = &local_408.field_2;
      lVar11 = 0;
      uVar9 = 0;
      do {
        lVar2 = *(long *)((long)&(local_438.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar11);
        if (lVar2 == 0) {
          pcVar3 = (matId->_M_dataplus)._M_p;
          local_408._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,pcVar3,pcVar3 + matId->_M_string_length);
        }
        else {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((local_438.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11)
          ;
          if ((pbVar6->_M_dataplus)._M_p[lVar2 + -1] == '/') {
            std::operator+(&local_408,pbVar6,matId);
          }
          else {
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            local_458.field_2._M_allocated_capacity._0_2_ = 0x2f;
            local_458._M_string_length = 1;
            psVar10 = (string *)pbVar6->_M_string_length;
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_458,0,0,(pbVar6->_M_dataplus)._M_p,(size_type)psVar10);
            local_3c0._0_8_ = (pbVar6->_M_dataplus)._M_p;
            paVar8 = &pbVar6->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._0_8_ == paVar8) {
              local_3b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_3b0._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              local_3c0._0_8_ = local_3c0 + 0x10;
            }
            else {
              local_3b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_3c0._8_8_ = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar6->_M_string_length = 0;
            (pbVar6->field_2)._M_local_buf[0] = '\0';
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3c0,(matId->_M_dataplus)._M_p,matId->_M_string_length);
            local_408._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
            paVar8 = &pbVar6->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p == paVar8) {
              local_408.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_408.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              local_408._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_408.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_408._M_string_length = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar6->_M_string_length = 0;
            (pbVar6->field_2)._M_local_buf[0] = '\0';
            if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p);
            }
          }
        }
        std::ifstream::ifstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   local_408._M_dataplus._M_p,_S_in);
        if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0) {
          LoadMtl(local_418,local_410,(istream *)local_3c0,local_420,psVar10);
          std::ifstream::~ifstream(local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != paVar1) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          bVar12 = true;
          goto LAB_0014cc12;
        }
        std::ifstream::~ifstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != paVar1) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar9 < (ulong)((long)local_438.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_438.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3c0 + 0x10),"Material file [ ",0x10);
    pMVar4 = local_3c8;
    psVar10 = local_420;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_3c0 + 0x10),(matId->_M_dataplus)._M_p,
                        matId->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ] not found in a path : ",0x19);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(pMVar4->m_mtlBaseDir)._M_dataplus._M_p,
                        (pMVar4->m_mtlBaseDir)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (psVar10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (psVar10,local_458._M_dataplus._M_p,local_458._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    bVar12 = false;
LAB_0014cc12:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream(local_1b8);
    std::ios_base::~ios_base(local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
  }
  return bVar12;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}